

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionInfo::AssertionInfo
          (AssertionInfo *this,string *_macroName,SourceLineInfo *_lineInfo,
          string *_capturedExpression,Flags _resultDisposition)

{
  pointer pcVar1;
  
  (this->macroName)._M_dataplus._M_p = (pointer)&(this->macroName).field_2;
  pcVar1 = (_macroName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + _macroName->_M_string_length);
  (this->lineInfo).file._M_dataplus._M_p = (pointer)&(this->lineInfo).file.field_2;
  pcVar1 = (_lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lineInfo,pcVar1,pcVar1 + (_lineInfo->file)._M_string_length);
  (this->lineInfo).line = _lineInfo->line;
  (this->capturedExpression)._M_dataplus._M_p = (pointer)&(this->capturedExpression).field_2;
  pcVar1 = (_capturedExpression->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->capturedExpression,pcVar1,
             pcVar1 + _capturedExpression->_M_string_length);
  this->resultDisposition = _resultDisposition;
  return;
}

Assistant:

AssertionInfo::AssertionInfo(   std::string const& _macroName,
                                    SourceLineInfo const& _lineInfo,
                                    std::string const& _capturedExpression,
                                    ResultDisposition::Flags _resultDisposition )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        capturedExpression( _capturedExpression ),
        resultDisposition( _resultDisposition )
    {}